

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

AutoCloseFd __thiscall kj::anon_unknown_8::DiskFilesystem::openDir(DiskFilesystem *this,char *dir)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_38;
  Fault f;
  SyscallResult local_20;
  undefined1 local_1c [4];
  SyscallResult _kjSyscallResult;
  int newFd;
  char *dir_local;
  AutoCloseFd *result;
  
  f.exception = (Exception *)local_1c;
  __kjSyscallResult = dir;
  local_20 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::DiskFilesystem::openDir(char_const*)::_lambda()_1_>
                       ((anon_class_16_2_1d2d75f8 *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_20);
  if (pvVar1 == (void *)0x0) {
    osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_20);
    kj::_::Debug::Fault::Fault
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x675,osErrorNumber,
               "newFd = open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY)","");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  AutoCloseFd::AutoCloseFd((AutoCloseFd *)this,(int)local_1c);
  return (AutoCloseFd)this;
}

Assistant:

static AutoCloseFd openDir(const char* dir) {
    int newFd;
    KJ_SYSCALL(newFd = open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY));
    AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif
    return result;
  }